

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

CTxDestination * wallet::getNewDestination(CWallet *w,OutputType output_type)

{
  long lVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  CTxDestination *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  CTxDestination *func;
  int line;
  undefined4 in_stack_ffffffffffffff40;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  allocator<char> local_81 [9];
  string *in_stack_ffffffffffffff88;
  CWallet *in_stack_ffffffffffffff90;
  OutputType in_stack_ffffffffffffffa4;
  
  line = (int)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __a = local_81;
  func = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,__a);
  CWallet::GetNewDestination
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff88);
  inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)__a,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffff40),line,(char *)func,
             (char *)in_RDI);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::operator*((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
               *)in_stack_ffffffffffffff08);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)in_stack_ffffffffffffff08,
            (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)0xec553b);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
             *)in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(in_stack_ffffffffffffff08);
  std::allocator<char>::~allocator(local_81);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return func;
  }
  __stack_chk_fail();
}

Assistant:

CTxDestination getNewDestination(CWallet& w, OutputType output_type)
{
    return *Assert(w.GetNewDestination(output_type, ""));
}